

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * stbi_load_from_callbacks
                    (stbi_io_callbacks *clbk,void *user,int *x,int *y,int *comp,int req_comp)

{
  uchar *puVar1;
  stbi__context s;
  stbi_io_callbacks *in_stack_fffffffffffffee8;
  stbi__context *in_stack_fffffffffffffef0;
  int in_stack_ffffffffffffff2c;
  int *in_stack_ffffffffffffff30;
  int *in_stack_ffffffffffffff38;
  int *in_stack_ffffffffffffff40;
  stbi__context *in_stack_ffffffffffffff48;
  
  stbi__start_callbacks(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,(void *)0x1d0191);
  puVar1 = stbi__load_and_postprocess_8bit
                     (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                      in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  return puVar1;
}

Assistant:

STBIDEF stbi_uc *stbi_load_from_callbacks(stbi_io_callbacks const *clbk, void *user, int *x, int *y, int *comp, int req_comp)
{
   stbi__context s;
   stbi__start_callbacks(&s, (stbi_io_callbacks *) clbk, user);
   return stbi__load_and_postprocess_8bit(&s,x,y,comp,req_comp);
}